

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O0

double __thiscall gmath::PinholeCamera::projectPoint(PinholeCamera *this,Vector2d *p,Vector3d *Pw)

{
  long *plVar1;
  double *pdVar2;
  double *pdVar3;
  SVector<double,_2> *in_RSI;
  Camera *in_RDI;
  double dVar4;
  double dVar5;
  double dVar6;
  double y;
  double x;
  double d;
  Vector3d Pc;
  SVector<double,_3> *in_stack_ffffffffffffff00;
  SMatrix<double,_3,_3> *in_stack_ffffffffffffff08;
  SVector<double,_3> *in_stack_ffffffffffffff10;
  SMatrix<double,_3,_3> *in_stack_ffffffffffffff18;
  double local_98;
  SVector<double,_3> local_30;
  SVector<double,_2> *local_10;
  
  local_10 = in_RSI;
  Camera::getR(in_RDI);
  transpose<double,3,3>(in_stack_ffffffffffffff08);
  Camera::getT(in_RDI);
  SVector<double,_3>::operator-
            ((SVector<double,_3> *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  SMatrix<double,_3,_3>::operator*(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  local_98 = std::numeric_limits<double>::infinity();
  dVar6 = in_RDI[1].R.v[0][2];
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_98 = in_RDI[1].R.v[0][2];
    pdVar2 = SVector<double,_3>::operator[](&local_30,2);
    local_98 = local_98 / *pdVar2;
  }
  pdVar2 = SVector<double,_3>::operator[](&local_30,2);
  if (*pdVar2 <= 0.0) {
    local_98 = -1.0;
  }
  pdVar2 = SVector<double,_3>::operator[](&local_30,2);
  SVector<double,_3>::operator/=(&local_30,*pdVar2);
  if (in_RDI[1].R.v[1][0] != 0.0) {
    pdVar2 = SVector<double,_3>::operator[](&local_30,0);
    dVar6 = *pdVar2;
    pdVar2 = SVector<double,_3>::operator[](&local_30,1);
    dVar4 = *pdVar2;
    plVar1 = (long *)in_RDI[1].R.v[1][0];
    pdVar2 = SVector<double,_3>::operator[](&local_30,0);
    pdVar3 = SVector<double,_3>::operator[](&local_30,1);
    (**(code **)(*plVar1 + 0x30))(dVar6,dVar4,plVar1,pdVar2,pdVar3);
  }
  dVar4 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 1),0,0);
  pdVar2 = SVector<double,_3>::operator[](&local_30,0);
  dVar6 = *pdVar2;
  dVar5 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 1),0,1);
  pdVar2 = SVector<double,_3>::operator[](&local_30,1);
  dVar4 = dVar4 * dVar6 + dVar5 * *pdVar2;
  dVar6 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 1),0,2);
  dVar4 = dVar4 + dVar6;
  pdVar2 = SVector<double,_2>::operator[](local_10,0);
  *pdVar2 = dVar4;
  dVar4 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 1),1,1);
  pdVar2 = SVector<double,_3>::operator[](&local_30,1);
  dVar6 = *pdVar2;
  dVar5 = SMatrix<double,_3,_3>::operator()((SMatrix<double,_3,_3> *)(in_RDI + 1),1,2);
  pdVar2 = SVector<double,_2>::operator[](local_10,1);
  *pdVar2 = dVar4 * dVar6 + dVar5;
  return local_98;
}

Assistant:

double PinholeCamera::projectPoint(Vector2d &p, const Vector3d &Pw) const
{
  // transform into camera coordiante system

  Vector3d Pc=transpose(getR())*(Pw-getT());

  // if rho is given, then compute disparity and determine if the point
  // is behind the camera

  double d=std::numeric_limits<double>::infinity();

  if (rho != 0)
  {
    d=rho/Pc[2];
  }

  if (Pc[2] <= 0)
  {
    d=-1;
  }

  // apply lens distortion

  Pc/=Pc[2];

  if (dist != 0)
  {
    const double x=Pc[0];
    const double y=Pc[1];
    dist->transform(Pc[0], Pc[1], x, y);
  }

  // apply camera matrix

  p[0]=A(0, 0)*Pc[0]+A(0, 1)*Pc[1]+A(0, 2);
  p[1]=A(1, 1)*Pc[1]+A(1, 2);

  return d;
}